

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

long uv__idna_toascii(char *s,char *se,char *d,char *de)

{
  char *se_00;
  uint uVar1;
  int iVar2;
  int rc;
  char *ds;
  uint c;
  char *st;
  char *si;
  char *de_local;
  char *d_local;
  char *se_local;
  char *s_local;
  
  st = s;
  si = de;
  de_local = d;
  d_local = se;
  se_local = s;
  while( true ) {
    do {
      se_00 = st;
      if (d_local <= st) {
        if ((se_local < d_local) &&
           (iVar2 = uv__idna_toascii_label(se_local,d_local,&de_local,si), iVar2 < 0)) {
          s_local = (char *)(long)iVar2;
        }
        else {
          if (de_local < si) {
            *de_local = '\0';
            de_local = de_local + 1;
          }
          s_local = de_local + -(long)d;
        }
        return (long)s_local;
      }
      uVar1 = uv__utf8_decode1(&st,d_local);
    } while ((((uVar1 != 0x2e) && (uVar1 != 0x3002)) && (uVar1 != 0xff0e)) && (uVar1 != 0xff61));
    iVar2 = uv__idna_toascii_label(se_local,se_00,&de_local,si);
    if (iVar2 < 0) break;
    if (de_local < si) {
      *de_local = '.';
      de_local = de_local + 1;
    }
    se_local = st;
  }
  return (long)iVar2;
}

Assistant:

long uv__idna_toascii(const char* s, const char* se, char* d, char* de) {
  const char* si;
  const char* st;
  unsigned c;
  char* ds;
  int rc;

  ds = d;

  for (si = s; si < se; /* empty */) {
    st = si;
    c = uv__utf8_decode1(&si, se);

    if (c != '.')
      if (c != 0x3002)  /* 。 */
        if (c != 0xFF0E)  /* ． */
          if (c != 0xFF61)  /* ｡ */
            continue;

    rc = uv__idna_toascii_label(s, st, &d, de);

    if (rc < 0)
      return rc;

    if (d < de)
      *d++ = '.';

    s = si;
  }

  if (s < se) {
    rc = uv__idna_toascii_label(s, se, &d, de);

    if (rc < 0)
      return rc;
  }

  if (d < de)
    *d++ = '\0';

  return d - ds;  /* Number of bytes written. */
}